

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall SM_Manager::CreateIndex(SM_Manager *this,char *relName,char *attrName)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint extraout_EAX;
  uint extraout_EAX_00;
  RC RVar4;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  ostream *poVar5;
  bool bVar6;
  IX_IndexHandle ih;
  AttrCatEntry *aEntry;
  RelCatEntry *rEntry;
  char *pData;
  RID rid;
  RM_Record attrRec;
  RM_Record rec;
  RM_Record relRec;
  RM_FileHandle fh;
  RM_FileScan fs;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"CreateIndex\n");
  poVar5 = std::operator<<(poVar5,"   relName =");
  poVar5 = std::operator<<(poVar5,relName);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"   attrName=");
  poVar5 = std::operator<<(poVar5,attrName);
  std::operator<<(poVar5,"\n");
  RM_Record::RM_Record(&relRec);
  uVar3 = GetRelEntry(this,relName,&relRec,&rEntry);
  if (uVar3 == 0) {
    RM_Record::RM_Record(&attrRec);
    uVar3 = FindAttr(this,relName,attrName,&attrRec,&aEntry);
    if (((uVar3 == 0) && (uVar3 = 0x132, aEntry->indexNo == -1)) &&
       (IX_Manager::DestroyIndex(this->ixm), uVar3 = extraout_EAX, extraout_EAX == 0)) {
      IX_Manager::DestroyIndex((IX_Manager *)&ih);
      RM_FileHandle::RM_FileHandle(&fh);
      RM_FileScan::RM_FileScan(&fs);
      IX_Manager::DestroyIndex(this->ixm);
      uVar3 = extraout_EAX_00;
      if (((extraout_EAX_00 == 0) &&
          (uVar3 = RM_Manager::OpenFile(this->rmm,relName,&fh), uVar3 == 0)) &&
         (uVar3 = RM_FileScan::OpenScan(&fs,&fh,INT,4,0,NO_OP,(void *)0x0,NO_HINT), uVar3 == 0)) {
        RM_Record::RM_Record(&rec);
        uVar3 = 0;
        do {
          RVar4 = RM_FileScan::GetNextRec(&fs,&rec);
          if (RVar4 == 0x6e) {
            uVar3 = RM_FileScan::CloseScan(&fs);
            if (((uVar3 == 0) && (uVar3 = RM_Manager::CloseFile(this->rmm,&fh), uVar3 == 0)) &&
               (IX_Manager::DestroyIndex(this->ixm), uVar3 = extraout_EAX_02, extraout_EAX_02 == 0))
            {
              uVar1 = rEntry->indexCount;
              uVar2 = rEntry->indexCurrNum;
              aEntry->indexNo = uVar2;
              rEntry->indexCount = uVar1 + 1;
              rEntry->indexCurrNum = uVar2 + 1;
              uVar3 = RM_FileHandle::UpdateRec(&this->relcatFH,&relRec);
              if (uVar3 == 0) {
                uVar3 = RM_FileHandle::UpdateRec(&this->attrcatFH,&attrRec);
                if (uVar3 == 0) {
                  RVar4 = RM_FileHandle::ForcePages(&this->relcatFH,-1);
                  if (RVar4 == 0) {
                    RVar4 = RM_FileHandle::ForcePages(&this->attrcatFH,-1);
                    uVar3 = (uint)(RVar4 != 0);
                  }
                  else {
                    uVar3 = 1;
                  }
                }
              }
            }
            break;
          }
          RID::RID(&rid);
          RVar4 = RM_Record::GetData(&rec,&pData);
          if ((RVar4 == 0) && (RVar4 = RM_Record::GetRid(&rec,&rid), RVar4 == 0)) {
            IX_IndexHandle::DeleteEntry(&ih);
            bVar6 = extraout_EAX_01 == 0;
            if (!bVar6) {
              uVar3 = extraout_EAX_01;
            }
          }
          else {
            bVar6 = false;
            uVar3 = 1;
          }
          RID::~RID(&rid);
        } while (bVar6);
        RM_Record::~RM_Record(&rec);
      }
      RM_FileScan::~RM_FileScan(&fs);
      RM_FileHandle::~RM_FileHandle(&fh);
      IX_IndexHandle::~IX_IndexHandle(&ih);
    }
    RM_Record::~RM_Record(&attrRec);
  }
  RM_Record::~RM_Record(&relRec);
  return uVar3;
}

Assistant:

RC SM_Manager::CreateIndex(const char *relName,
                           const char *attrName)
{
  cout << "CreateIndex\n"
    << "   relName =" << relName << "\n"
    << "   attrName=" << attrName << "\n";

  RC rc = 0;
  RM_Record relRec;
  RelCatEntry *rEntry;
  if((rc = GetRelEntry(relName, relRec, rEntry))) // get the relation info
    return (rc);

  // Find the attribute associated with this index
  RM_Record attrRec; 
  AttrCatEntry *aEntry;
  if((rc = FindAttr(relName, attrName, attrRec, aEntry))){
    return (rc);
  }

  // check there isnt already an index
  if(aEntry->indexNo != NO_INDEXES)
    return (SM_INDEXEDALREADY);

  // Create this index
  if((rc = ixm.CreateIndex(relName, rEntry->indexCurrNum, aEntry->attrType, aEntry->attrLength)))
    return (rc);

  // Gets ready to scan through the file associated with the relation
  IX_IndexHandle ih;
  RM_FileHandle fh;
  RM_FileScan fs;
  if((rc = ixm.OpenIndex(relName, rEntry->indexCurrNum, ih)))
    return (rc);
  if((rc = rmm.OpenFile(relName, fh)))
    return (rc);

  // scan through the entire file:
  if((rc = fs.OpenScan(fh, INT, 4, 0, NO_OP, NULL))){
    return (rc);
  }
  RM_Record rec;
  while(fs.GetNextRec(rec) != RM_EOF){
    char *pData;
    RID rid;
    if((rc = rec.GetData(pData) || (rc = rec.GetRid(rid)))) // retrieve the record
      return (rc);
    if((rc = ih.InsertEntry(pData+ aEntry->offset, rid))) // insert into index
      return (rc);
  }
  if((rc = fs.CloseScan()) || (rc = rmm.CloseFile(fh)) || (rc = ixm.CloseIndex(ih)))
    return (rc);
  // Close all scans, indices and files
  
  // rewrite entry for attribute and relation in attrcat and relcat
  aEntry->indexNo = rEntry->indexCurrNum;
  rEntry->indexCurrNum++;
  rEntry->indexCount++;

  // write both back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = attrcatFH.UpdateRec(attrRec)))
    return (rc);
  if((rc = relcatFH.ForcePages() || (rc = attrcatFH.ForcePages())))
    return (rc);

  return (0);
}